

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O1

QList<QByteArrayView> * __thiscall
QTimeZonePrivate::matchingTimeZoneIds
          (QList<QByteArrayView> *__return_storage_ptr__,QTimeZonePrivate *this,int offsetFromUtc)

{
  short sVar1;
  long lVar2;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  short *psVar6;
  long lVar7;
  long in_FS_OFFSET;
  iterator __begin4;
  QByteArrayView local_a8;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QByteArrayView *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar7 = 0;
  do {
    if (*(int *)((long)&DAT_005a7e88 + lVar7) == offsetFromUtc) {
      sVar1 = *(short *)((long)&QtTimeZoneCldr::windowsDataTable + lVar7);
      psVar6 = &QtTimeZoneCldr::zoneDataTable;
      uVar5 = 0x169;
      do {
        uVar3 = uVar5 >> 1;
        uVar4 = uVar3;
        if ((int)(uint)(ushort)psVar6[uVar3 * 3] < (int)sVar1) {
          uVar4 = ~uVar3 + uVar5;
          psVar6 = psVar6 + uVar3 * 3 + 3;
        }
        uVar5 = uVar4;
      } while (0 < (long)uVar4);
      for (; (psVar6 != (short *)&DAT_005a7e76 && (*psVar6 == sVar1)); psVar6 = psVar6 + 3) {
        local_58.m_haystack.m_data = "Asia/Kabul" + (ushort)psVar6[2];
        local_58.m_haystack.m_size = -1;
        do {
          lVar2 = local_58.m_haystack.m_size + (ulong)(ushort)psVar6[2] + 1;
          local_58.m_haystack.m_size = local_58.m_haystack.m_size + 1;
        } while ("Asia/Kabul"[lVar2] != '\0');
        local_58.super_QStringTokenizerBaseBase.m_sb.
        super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
        super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
             (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
        local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
        local_58.m_needle.ucs = L' ';
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator
                  ((iterator *)local_98,&local_58);
        if (local_98[0x18] == true) {
          do {
            local_a8.m_size = local_98._8_8_;
            local_a8.m_data = (storage_type *)local_98._16_8_;
            QtPrivate::QPodArrayOps<QByteArrayView>::emplace<QByteArrayView>
                      ((QPodArrayOps<QByteArrayView> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,&local_a8);
            QList<QByteArrayView>::end(__return_storage_ptr__);
            QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_98);
          } while (local_98[0x18] != false);
        }
      }
    }
    lVar7 = lVar7 + 0xc;
  } while (lVar7 != 0x684);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArrayView> QTimeZonePrivate::matchingTimeZoneIds(int offsetFromUtc) const
{
    // Default fall-back mode: use the zoneTable to find offsets of know zones.
    QList<QByteArrayView> offsets;
    // First get all Zones in the table using the given offset:
    for (const WindowsData &winData : windowsDataTable) {
        if (winData.offsetFromUtc == offsetFromUtc) {
            for (auto data = zoneStartForWindowsId(winData.windowsIdKey);
                 data != std::end(zoneDataTable) && data->windowsIdKey == winData.windowsIdKey;
                 ++data) {
                for (auto l1 : data->ids())
                    offsets << QByteArrayView(l1.data(), l1.size());
            }
        }
    }
    return offsets;
}